

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O2

void __thiscall cmSourceGroup::~cmSourceGroup(cmSourceGroup *this)

{
  std::unique_ptr<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>::~unique_ptr
            (&this->Internal);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&(this->SourceFiles).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->GroupFiles)._M_t);
  cmsys::RegularExpression::~RegularExpression(&this->GroupRegex);
  std::__cxx11::string::~string((string *)&this->FullName);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmSourceGroup::~cmSourceGroup() = default;